

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextformat.h
# Opt level: O2

qreal __thiscall
QTextBlockFormat::lineHeight(QTextBlockFormat *this,qreal scriptLineHeight,qreal scaling)

{
  int iVar1;
  qreal qVar2;
  qreal qVar3;
  
  iVar1 = QTextFormat::intProperty(&this->super_QTextFormat,0x1049);
  switch(iVar1) {
  case 0:
    qVar2 = scriptLineHeight;
    break;
  case 1:
    qVar2 = QTextFormat::doubleProperty(&this->super_QTextFormat,0x1048);
    qVar2 = (qVar2 * scriptLineHeight) / 100.0;
    break;
  case 2:
    qVar2 = QTextFormat::doubleProperty(&this->super_QTextFormat,0x1048);
    qVar2 = qVar2 * scaling;
    break;
  case 3:
    qVar3 = QTextFormat::doubleProperty(&this->super_QTextFormat,0x1048);
    qVar2 = qVar3 * scaling;
    if (qVar3 * scaling <= scriptLineHeight) {
      qVar2 = scriptLineHeight;
    }
    break;
  case 4:
    qVar2 = QTextFormat::doubleProperty(&this->super_QTextFormat,0x1048);
    qVar2 = qVar2 * scaling + scriptLineHeight;
    break;
  default:
    qVar2 = 0.0;
  }
  return qVar2;
}

Assistant:

inline qreal QTextBlockFormat::lineHeight(qreal scriptLineHeight, qreal scaling = 1.0) const
{
  switch(intProperty(LineHeightType)) {
    case SingleHeight:
      return(scriptLineHeight);
    case ProportionalHeight:
      return(scriptLineHeight * doubleProperty(LineHeight) / 100.0);
    case FixedHeight:
      return(doubleProperty(LineHeight) * scaling);
    case MinimumHeight:
      return(qMax(scriptLineHeight, doubleProperty(LineHeight) * scaling));
    case LineDistanceHeight:
      return(scriptLineHeight + doubleProperty(LineHeight) * scaling);
  }
  return(0);
}